

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

uint XXH32(void *input,int len,U32 seed)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  uint in_EDX;
  int in_ESI;
  byte *in_RDI;
  XXH_endianess endian_detected;
  U32 v4_1;
  U32 v3_1;
  U32 v2_1;
  U32 v1_1;
  BYTE *limit_1;
  U32 h32_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  U32 v4;
  U32 v3;
  U32 v2;
  U32 v1;
  BYTE *limit;
  U32 h32;
  BYTE *bEnd;
  BYTE *p;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_11c;
  byte *local_110;
  
  pbVar5 = in_RDI + in_ESI;
  local_110 = in_RDI;
  if (in_ESI < 0x10) {
    local_11c = in_EDX + 0x165667b1;
  }
  else {
    local_12c = in_EDX + 0x24234428;
    local_130 = in_EDX + 0x85ebca77;
    local_138 = in_EDX + 0x61c8864f;
    local_134 = in_EDX;
    do {
      local_12c = *(int *)local_110 * -0x7a143589 + local_12c;
      uVar1 = local_12c * 0x2000 | local_12c >> 0x13;
      local_12c = uVar1 * -0x61c8864f;
      local_130 = *(int *)(local_110 + 4) * -0x7a143589 + local_130;
      uVar2 = local_130 * 0x2000 | local_130 >> 0x13;
      local_130 = uVar2 * -0x61c8864f;
      local_134 = *(int *)(local_110 + 8) * -0x7a143589 + local_134;
      uVar3 = local_134 * 0x2000 | local_134 >> 0x13;
      local_134 = uVar3 * -0x61c8864f;
      local_138 = *(int *)(local_110 + 0xc) * -0x7a143589 + local_138;
      uVar4 = local_138 * 0x2000 | local_138 >> 0x13;
      local_138 = uVar4 * -0x61c8864f;
      local_110 = local_110 + 0x10;
    } while (local_110 <= pbVar5 + -0x10);
    local_11c = (uVar1 * 0x3c6ef362 | local_12c >> 0x1f) + (uVar2 * 0x1bbcd880 | local_130 >> 0x19)
                + (uVar3 * 0x779b1000 | local_134 >> 0x14) +
                (uVar4 * -0x193c0000 | local_138 >> 0xe);
  }
  local_11c = in_ESI + local_11c;
  for (; local_110 <= pbVar5 + -4; local_110 = local_110 + 4) {
    local_11c = *(int *)local_110 * -0x3d4d51c3 + local_11c;
    local_11c = (local_11c * 0x20000 | local_11c >> 0xf) * 0x27d4eb2f;
  }
  for (; local_110 < pbVar5; local_110 = local_110 + 1) {
    local_11c = (uint)*local_110 * 0x165667b1 + local_11c;
    local_11c = (local_11c * 0x800 | local_11c >> 0x15) * -0x61c8864f;
  }
  uVar1 = (local_11c >> 0xf ^ local_11c) * -0x7a143589;
  uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51c3;
  return uVar1 >> 0x10 ^ uVar1;
}

Assistant:

U32 XXH32(const void* input, int len, U32 seed)
{
#if 0
    // Simple version, good for code maintenance, but unfortunately slow for small inputs
    void* state = XXH32_init(seed);
    XXH32_update(state, input, len);
    return XXH32_digest(state);
#else
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

#  if !defined(XXH_USE_UNALIGNED_ACCESS)
    if ((((size_t)input) & 3))   // Input is aligned, let's leverage the speed advantage
    {
        if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
            return XXH32_endian_align(input, len, seed, XXH_littleEndian, XXH_aligned);
        else
            return XXH32_endian_align(input, len, seed, XXH_bigEndian, XXH_aligned);
    }
#  endif

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH32_endian_align(input, len, seed, XXH_littleEndian, XXH_unaligned);
    else
        return XXH32_endian_align(input, len, seed, XXH_bigEndian, XXH_unaligned);
#endif
}